

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O3

list<GreenCard_*,_std::allocator<GreenCard_*>_> * __thiscall
DeckBuilder::createFateDeck_abi_cxx11_(DeckBuilder *this)

{
  size_t *psVar1;
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *plVar2;
  bool bVar3;
  bool bVar4;
  Footsoldier *this_00;
  _List_node_base *p_Var5;
  Archer *this_01;
  Sieger *this_02;
  Cavalry *this_03;
  Atakebune *this_04;
  Bushido *this_05;
  Katana *this_06;
  Bow *this_07;
  Spear *this_08;
  Ninjato *this_09;
  Wakizashi *this_10;
  int iVar6;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar6 = 6;
  do {
    plVar2 = this->green;
    this_00 = (Footsoldier *)operator_new(0x158);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Peasants","");
    Footsoldier::Footsoldier(this_00,&local_50,3,1);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 6;
  do {
    plVar2 = this->green;
    this_01 = (Archer *)operator_new(0x158);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Elite Troops","");
    Archer::Archer(this_01,&local_70,3,2);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_01;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 4;
  do {
    plVar2 = this->green;
    this_02 = (Sieger *)operator_new(0x158);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Immortal Bushi","");
    Sieger::Sieger(this_02,&local_90,3,3);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_02;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 5;
  do {
    plVar2 = this->green;
    this_03 = (Cavalry *)operator_new(0x158);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Unicorn Horses","");
    Cavalry::Cavalry(this_03,&local_b0,3,4);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_03;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 5;
  do {
    plVar2 = this->green;
    this_04 = (Atakebune *)operator_new(0x158);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Yomi Ships","");
    Atakebune::Atakebune(this_04,&local_d0,3,5);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_04;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  bVar3 = true;
  do {
    bVar4 = bVar3;
    plVar2 = this->green;
    this_05 = (Bushido *)operator_new(0x158);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"7 Samurai","");
    Bushido::Bushido(this_05,&local_f0,3,6);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_05;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  } while (bVar4);
  iVar6 = 4;
  do {
    plVar2 = this->green;
    this_06 = (Katana *)operator_new(0x168);
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Daijtso","");
    Katana::Katana(this_06,&local_190,4,1);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_06;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  bVar3 = true;
  do {
    bVar4 = bVar3;
    plVar2 = this->green;
    this_07 = (Bow *)operator_new(0x168);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Yumi","");
    Bow::Bow(this_07,&local_110,4,3);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_07;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  } while (bVar4);
  iVar6 = 3;
  do {
    plVar2 = this->green;
    this_08 = (Spear *)operator_new(0x168);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Kama","");
    Spear::Spear(this_08,&local_130,4,2);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_08;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  bVar3 = true;
  do {
    bVar4 = bVar3;
    plVar2 = this->green;
    this_09 = (Ninjato *)operator_new(0x168);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Butterfly Dagger","");
    Ninjato::Ninjato(this_09,&local_150,4,4);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_09;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  } while (bVar4);
  plVar2 = this->green;
  this_10 = (Wakizashi *)operator_new(0x168);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Kusanagi","");
  Wakizashi::Wakizashi(this_10,&local_170,4,5);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)this_10;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(plVar2->super__List_base<GreenCard_*,_std::allocator<GreenCard_*>_>)._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  return this->green;
}

Assistant:

list<GreenCard *> *DeckBuilder::createFateDeck()
{
    //enum Type{PERSONALITY = 1, HOLDING, FOLLOWER, ITEM};
    //added 2 ints in constructors
    //first int corresponds to Card::Type enum
    //second to Card::Followers, Items, Personalities or Holdings

	int i;
	for (i = 0; i < NO_FOOTSOLDIER; i++)
		green->push_back(new Footsoldier{"Peasants", 3, 1});
	for (i = 0; i < NO_ARCHER; i++)
		green->push_back(new Archer{"Elite Troops", 3, 2});
	for (i = 0; i < NO_SIEGER; i++)
		green->push_back(new Sieger{"Immortal Bushi", 3, 3});
	for (i = 0; i < NO_CAVALRY; i++)
		green->push_back(new Cavalry{"Unicorn Horses", 3, 4});
	for (i = 0; i < NO_NAVAL; i++)
		green->push_back(new Atakebune{"Yomi Ships", 3, 5});
	for (i = 0; i < NO_BUSHIDO; i++)
		green->push_back(new Bushido{"7 Samurai", 3, 6});

	for (i = 0; i < NO_KATANA; i++)
		green->push_back(new Katana{"Daijtso", 4, 1});
	for (i = 0; i < NO_BOW; i++)
		green->push_back(new Bow{"Yumi", 4, 3});
	for (i = 0; i < NO_SPEAR; i++)
		green->push_back(new Spear{"Kama", 4, 2});
	for (i = 0; i < NO_NINJATO; i++)
		green->push_back(new Ninjato{"Butterfly Dagger", 4, 4});
	for (i = 0; i < NO_WAKIZASHI; i++)
		green->push_back(new Wakizashi{"Kusanagi", 4, 5});

	return green;
}